

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-CTA-cs16btech11038.cpp
# Opt level: O0

void __thiscall FOCC_CTA::FOCC_CTA(FOCC_CTA *this,int m)

{
  DataItem *this_00;
  map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  local_80;
  DataItem *local_40;
  int local_34;
  undefined1 local_30 [4];
  int i;
  int local_14;
  FOCC_CTA *pFStack_10;
  int m_local;
  FOCC_CTA *this_local;
  
  local_14 = m;
  pFStack_10 = this;
  std::vector<DataItem_*,_std::allocator<DataItem_*>_>::vector(&this->dataItems);
  std::
  map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>::
  map(&this->transactions);
  std::shared_mutex::shared_mutex(&this->scheduler_lock);
  this->M = local_14;
  this->counter = 0;
  memset(local_30,0,0x18);
  std::vector<DataItem_*,_std::allocator<DataItem_*>_>::vector
            ((vector<DataItem_*,_std::allocator<DataItem_*>_> *)local_30);
  std::vector<DataItem_*,_std::allocator<DataItem_*>_>::operator=
            (&this->dataItems,(vector<DataItem_*,_std::allocator<DataItem_*>_> *)local_30);
  std::vector<DataItem_*,_std::allocator<DataItem_*>_>::~vector
            ((vector<DataItem_*,_std::allocator<DataItem_*>_> *)local_30);
  for (local_34 = 0; local_34 < this->M; local_34 = local_34 + 1) {
    this_00 = (DataItem *)operator_new(0x60);
    DataItem::DataItem(this_00,-2);
    local_40 = this_00;
    std::vector<DataItem_*,_std::allocator<DataItem_*>_>::push_back(&this->dataItems,&local_40);
  }
  memset(&local_80,0,0x30);
  std::
  map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>::
  map(&local_80);
  std::
  map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>::
  operator=(&this->transactions,&local_80);
  std::
  map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>::
  ~map(&local_80);
  return;
}

Assistant:

FOCC_CTA::FOCC_CTA(int m): M(m){
    counter = 0;

    dataItems = std::vector<DataItem*>();
    for(int i=0; i<M; i++) dataItems.push_back(new DataItem(DataItem::INIT));

    transactions = std::map<int, Transaction*>();

}